

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::synchronization::makeImageView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkImage image,VkImageViewType viewType,VkFormat format,
          VkImageSubresourceRange subresourceRange)

{
  VkImageSubresourceRange VVar1;
  undefined1 local_80 [8];
  VkImageViewCreateInfo imageViewParams;
  VkFormat format_local;
  VkImageViewType viewType_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkImage image_local;
  
  VVar1 = subresourceRange;
  local_80._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewParams._4_4_ = 0;
  imageViewParams.pNext._0_4_ = 0;
  imageViewParams._16_8_ = image.m_internal;
  imageViewParams.image.m_internal._0_4_ = viewType;
  imageViewParams.image.m_internal._4_4_ = format;
  imageViewParams.subresourceRange.layerCount = format;
  imageViewParams._76_4_ = viewType;
  imageViewParams._32_16_ = ::vk::makeComponentMappingRGBA();
  imageViewParams.components.b = subresourceRange.aspectMask;
  imageViewParams.components.a = subresourceRange.baseMipLevel;
  subresourceRange._8_8_ = VVar1._8_8_;
  imageViewParams.subresourceRange.aspectMask = subresourceRange.levelCount;
  imageViewParams.subresourceRange.baseMipLevel = subresourceRange.baseArrayLayer;
  subresourceRange.layerCount = VVar1.layerCount;
  imageViewParams.subresourceRange.levelCount = subresourceRange.layerCount;
  ::vk::createImageView
            (__return_storage_ptr__,vk,device,(VkImageViewCreateInfo *)local_80,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImageView> makeImageView (const DeviceInterface&			vk,
								 const VkDevice					device,
								 const VkImage					image,
								 const VkImageViewType			viewType,
								 const VkFormat					format,
								 const VkImageSubresourceRange	subresourceRange)
{
	const VkImageViewCreateInfo imageViewParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageViewCreateFlags)0,						// VkImageViewCreateFlags	flags;
		image,											// VkImage					image;
		viewType,										// VkImageViewType			viewType;
		format,											// VkFormat					format;
		makeComponentMappingRGBA(),						// VkComponentMapping		components;
		subresourceRange,								// VkImageSubresourceRange	subresourceRange;
	};
	return createImageView(vk, device, &imageViewParams);
}